

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers.cpp
# Opt level: O0

void printEvents(istream *input,ostream *output,string *format,string *dateFormat)

{
  Event *pEVar1;
  string *in_RCX;
  string *in_RDX;
  EventStream *in_RSI;
  Event *event;
  PrettyPrinter pp;
  EventStream eventStream;
  IstreamEntryStream entryStream;
  ClockSync *in_stack_00000280;
  WriterProp *in_stack_00000288;
  Event *in_stack_00000290;
  ostream *in_stack_00000298;
  PrettyPrinter *in_stack_000002a0;
  istream *in_stack_fffffffffffffe28;
  EventStream *in_stack_fffffffffffffe30;
  string local_1a8 [8];
  string *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  PrettyPrinter *in_stack_fffffffffffffe70;
  string local_188 [24];
  EntryStream *in_stack_fffffffffffffe90;
  EventStream *in_stack_fffffffffffffe98;
  EventStream local_108;
  string *local_20;
  string *local_18;
  EventStream *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  binlog::IstreamEntryStream::IstreamEntryStream
            ((IstreamEntryStream *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  binlog::EventStream::EventStream(in_stack_fffffffffffffe30);
  std::__cxx11::string::string(local_188,local_18);
  std::__cxx11::string::string(local_1a8,local_20);
  binlog::PrettyPrinter::PrettyPrinter
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_188);
  while( true ) {
    pEVar1 = binlog::EventStream::nextEvent(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    if (pEVar1 == (Event *)0x0) break;
    in_stack_fffffffffffffe30 = local_10;
    binlog::EventStream::writerProp(&local_108);
    binlog::EventStream::clockSync(&local_108);
    binlog::PrettyPrinter::printEvent
              (in_stack_000002a0,in_stack_00000298,in_stack_00000290,in_stack_00000288,
               in_stack_00000280);
  }
  binlog::PrettyPrinter::~PrettyPrinter((PrettyPrinter *)in_stack_fffffffffffffe30);
  binlog::EventStream::~EventStream(in_stack_fffffffffffffe30);
  binlog::IstreamEntryStream::~IstreamEntryStream((IstreamEntryStream *)in_stack_fffffffffffffe30);
  return;
}

Assistant:

void printEvents(std::istream& input, std::ostream& output, const std::string& format, const std::string& dateFormat)
{
  binlog::IstreamEntryStream entryStream(input);
  binlog::EventStream eventStream;
  binlog::PrettyPrinter pp(format, dateFormat);

  while (const binlog::Event* event = eventStream.nextEvent(entryStream))
  {
    pp.printEvent(output, *event, eventStream.writerProp(), eventStream.clockSync());
  }
}